

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O3

int uv__fs_statx(int fd,char *path,int is_fstat,int is_lstat,uv_stat_t *buf)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint *puVar4;
  uv__statx statxbuf;
  uv__statx uStack_108;
  
  iVar3 = -0x26;
  if (uv__fs_statx::no_statx == 0) {
    if (is_fstat == 0) {
      fd = -100;
    }
    iVar2 = (uint)(is_fstat != 0) * 0x1000;
    iVar3 = iVar2 + 0x100;
    if (is_lstat == 0) {
      iVar3 = iVar2;
    }
    iVar3 = uv__statx(fd,path,iVar3,0xfff,&uStack_108);
    if (iVar3 == 0) {
      uv__statx_to_stat(&uStack_108,buf);
      iVar3 = 0;
    }
    else {
      if (iVar3 == -1) {
        puVar4 = (uint *)__errno_location();
        uVar1 = *puVar4;
        if (((0x26 < (ulong)uVar1) || ((0x4000400002U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
           (uVar1 != 0x5f)) {
          return -1;
        }
      }
      uv__fs_statx::no_statx = 1;
      iVar3 = -0x26;
    }
  }
  return iVar3;
}

Assistant:

static int uv__fs_statx(int fd,
                        const char* path,
                        int is_fstat,
                        int is_lstat,
                        uv_stat_t* buf) {
  STATIC_ASSERT(UV_ENOSYS != -1);
#ifdef __linux__
  static _Atomic int no_statx;
  struct uv__statx statxbuf;
  int dirfd;
  int flags;
  int mode;
  int rc;

  if (atomic_load_explicit(&no_statx, memory_order_relaxed))
    return UV_ENOSYS;

  dirfd = AT_FDCWD;
  flags = 0; /* AT_STATX_SYNC_AS_STAT */
  mode = 0xFFF; /* STATX_BASIC_STATS + STATX_BTIME */

  if (is_fstat) {
    dirfd = fd;
    flags |= 0x1000; /* AT_EMPTY_PATH */
  }

  if (is_lstat)
    flags |= AT_SYMLINK_NOFOLLOW;

  rc = uv__statx(dirfd, path, flags, mode, &statxbuf);

  switch (rc) {
  case 0:
    break;
  case -1:
    /* EPERM happens when a seccomp filter rejects the system call.
     * Has been observed with libseccomp < 2.3.3 and docker < 18.04.
     * EOPNOTSUPP is used on DVS exported filesystems
     */
    if (errno != EINVAL && errno != EPERM && errno != ENOSYS && errno != EOPNOTSUPP)
      return -1;
    /* Fall through. */
  default:
    /* Normally on success, zero is returned and On error, -1 is returned.
     * Observed on S390 RHEL running in a docker container with statx not
     * implemented, rc might return 1 with 0 set as the error code in which
     * case we return ENOSYS.
     */
    atomic_store_explicit(&no_statx, 1, memory_order_relaxed);
    return UV_ENOSYS;
  }

  uv__statx_to_stat(&statxbuf, buf);

  return 0;
#else
  return UV_ENOSYS;
#endif /* __linux__ */
}